

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test::
TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test
          (TEST_MemoryReporterPlugin_mallocAllocationsAreReportedTest_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).memLeakAllocatorComparator.
  super_MockNamedValueComparator._vptr_MockNamedValueComparator = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output.output.buffer_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output.output.bufferSize_ = 0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output.super_TestOutput.color_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output.super_TestOutput.
  progressIndication_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output.super_TestOutput.
  _vptr_TestOutput = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output.super_TestOutput.dotCount_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output.super_TestOutput.verbose_ =
       level_quiet;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter =
       (MemoryReporterPluginUnderTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).test = (UtestShell *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMemoryReporterPlugin_002af980;
  StringBufferTestOutput::StringBufferTestOutput
            (&(this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output);
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).memLeakAllocatorComparator.
  super_MockNamedValueComparator._vptr_MockNamedValueComparator =
       (_func_int **)&PTR__MockNamedValueComparator_002af9c0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMemoryReporterPlugin_002af508;
  return;
}

Assistant:

TEST(MemoryReporterPlugin, mallocAllocationsAreReportedTest)
{
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentMallocAllocator()->allocMemoryLeakNode(100);
    getCurrentMallocAllocator()->free_memory(memory, 100, "unknown", 1);
}